

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::add_extension(torrent *this,shared_ptr<libtorrent::torrent_plugin> *ext)

{
  pointer pppVar1;
  peer_connection *this_00;
  element_type *peVar2;
  pointer pppVar3;
  shared_ptr<libtorrent::peer_plugin> pp;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined8 local_78;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  shared_ptr<libtorrent::peer_plugin> local_68;
  undefined8 local_58;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  torrent *local_48;
  __shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  ::std::__cxx11::
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  ::push_back(&this->m_extensions,ext);
  pppVar1 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = this;
  for (pppVar3 = (this->super_torrent_hot_members).m_connections.
                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 .
                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pppVar3 != pppVar1;
      pppVar3 = pppVar3 + 1) {
    this_00 = *pppVar3;
    peVar2 = (ext->super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::peer_connection,void>
              ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               &local_40,
               (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
               &this_00->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
    ::std::__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::peer_connection,void>
              ((__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&local_78,
               &local_40);
    local_58 = local_78;
    _Stack_50._M_pi = _Stack_70._M_pi;
    local_78 = 0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (*peVar2->_vptr_torrent_plugin[2])(&local_88,peVar2,&local_58);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_50);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_70);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if (local_88 != (element_type *)0x0) {
      local_68.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_88;
      local_68.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_80._M_pi;
      local_88 = (element_type *)0x0;
      _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peer_connection::add_extension(this_00,&local_68);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_68.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
  }
  if (((local_48->super_torrent_hot_members).field_0x4b & 2) != 0) {
    (*((ext->super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_torrent_plugin[8])();
  }
  return;
}

Assistant:

void torrent::add_extension(std::shared_ptr<torrent_plugin> ext)
	{
		m_extensions.push_back(ext);

		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			std::shared_ptr<peer_plugin> pp(ext->new_connection(peer_connection_handle(p->self())));
			if (pp) p->add_extension(std::move(pp));
		}

		// if files are checked for this torrent, call the extension
		// to let it initialize itself
		if (m_connections_initialized)
			ext->on_files_checked();
	}